

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::CreateShadProgCase::iterate(CreateShadProgCase *this)

{
  bool bVar1;
  int iVar2;
  GLenum GVar3;
  TestLog *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  MessageBuilder *this_01;
  char *pcVar5;
  TestError *pTVar6;
  long lVar7;
  MessageBuilder local_200;
  GLenum local_80;
  GLuint local_7c;
  GLenum err;
  GLuint program;
  char *srcStrings [10];
  int i;
  Functions *gl;
  TestLog *log;
  CreateShadProgCase *this_local;
  Functions *gl_00;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  tcu::TestLog::operator<<(&local_200,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<
                      (&local_200,(char (*) [33])"Begin:CreateShadProgCase iterate");
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_200);
  srcStrings[9]._4_4_ = 0;
  pcVar5 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = pcVar5;
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = "\n";
  if (8 < (int)this->m_glslVersion) {
    lVar7 = (long)srcStrings[9]._4_4_;
    srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
    *(char **)(&err + lVar7 * 2) = "out gl_PerVertex {\n  vec4 gl_Position;\n};\n";
  }
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = "in vec4 a_position;\n";
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = "void main ()\n";
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = "{\n";
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = "    gl_Position = a_position;\n";
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = "}\n";
  local_7c = (*gl_00->createShaderProgramv)(0x8b31,srcStrings[9]._4_4_,(GLchar **)&err);
  bVar1 = checkCSProg(this,gl_00,local_7c,1,1);
  if (!bVar1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"CreateShaderProgramv failed for vertex shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x244);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->deleteProgram)(local_7c);
  srcStrings[9]._4_4_ = 0;
  pcVar5 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = pcVar5;
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = "\n";
  if (8 < (int)this->m_glslVersion) {
    lVar7 = (long)srcStrings[9]._4_4_;
    srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
    *(char **)(&err + lVar7 * 2) = "out gl_PerVertex {\n  vec4 gl_Position;\n};\n";
  }
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = "in vec4 a_position;\nvoid main ()\n";
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = "{\n    gl_Position = a_position;\n";
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = "}\n";
  local_7c = (*gl_00->createShaderProgramv)(0x8b31,srcStrings[9]._4_4_,(GLchar **)&err);
  bVar1 = checkCSProg(this,gl_00,local_7c,1,1);
  if (!bVar1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"CreateShaderProgramv failed for vertex shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x25c);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->deleteProgram)(local_7c);
  srcStrings[9]._4_4_ = 0;
  pcVar5 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = pcVar5;
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = "\nin highp vec4 u_color;\n";
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = "layout(location = 0) out mediump vec4 o_color;\n";
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = "void main ()\n";
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = "{\n";
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = "    o_color = u_color;\n";
  lVar7 = (long)srcStrings[9]._4_4_;
  srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
  *(char **)(&err + lVar7 * 2) = "}\n";
  local_7c = (*gl_00->createShaderProgramv)(0x8b30,srcStrings[9]._4_4_,(GLchar **)&err);
  bVar1 = checkCSProg(this,gl_00,local_7c,1,1);
  if (!bVar1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"CreateShaderProgramv failed for fragment shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x26e);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->deleteProgram)(local_7c);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"CreateShaderProgramv failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x273);
  local_7c = (*gl_00->createShaderProgramv)(0x8dfd,srcStrings[9]._4_4_,(GLchar **)&err);
  local_80 = (*gl_00->getError)();
  if ((local_7c == 0) && (local_80 == 0x500)) {
    local_7c = (*gl_00->createShaderProgramv)(0x8b30,-1,(GLchar **)&err);
    local_80 = (*gl_00->getError)();
    if ((local_7c == 0) && (local_80 == 0x501)) {
      srcStrings[9]._4_4_ = 0;
      pcVar5 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
      lVar7 = (long)srcStrings[9]._4_4_;
      srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
      *(char **)(&err + lVar7 * 2) = pcVar5;
      lVar7 = (long)srcStrings[9]._4_4_;
      srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
      *(char **)(&err + lVar7 * 2) = "\nin highp vec4 u_color;\n";
      lVar7 = (long)srcStrings[9]._4_4_;
      srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
      *(char **)(&err + lVar7 * 2) = "layout(location = 0) out mediump vec4 o_color;\n";
      lVar7 = (long)srcStrings[9]._4_4_;
      srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
      *(char **)(&err + lVar7 * 2) = "void main ()\n";
      lVar7 = (long)srcStrings[9]._4_4_;
      srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
      *(char **)(&err + lVar7 * 2) = "{\n";
      lVar7 = (long)srcStrings[9]._4_4_;
      srcStrings[9]._4_4_ = srcStrings[9]._4_4_ + 1;
      *(char **)(&err + lVar7 * 2) = "    o_color = u_color;\n";
      local_7c = (*gl_00->createShaderProgramv)(0x8b30,srcStrings[9]._4_4_,(GLchar **)&err);
      bVar1 = checkCSProg(this,gl_00,local_7c,0,0);
      if (!bVar1) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"CreateShaderProgramv failed for fragment shader",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x294);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      GVar3 = (*gl_00->getError)();
      glu::checkError(GVar3,"CreateShaderProgramv failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                      ,0x296);
      (*gl_00->deleteProgram)(local_7c);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"CreateShaderProgramv failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x284);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"CreateShaderProgramv failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
             ,0x27c);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate(void)
	{
		TestLog&			  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		int					  i;
		const char*			  srcStrings[10];
		glw::GLuint			  program;
		glw::GLenum			  err;

		// CreateShaderProgramv verification
		log << TestLog::Message << "Begin:CreateShadProgCase iterate" << TestLog::EndMessage;

		// vertex shader
		i				= 0;
		srcStrings[i++] = glu::getGLSLVersionDeclaration(m_glslVersion);
		srcStrings[i++] = "\n";
		if (m_glslVersion >= glu::GLSL_VERSION_410)
		{
			srcStrings[i++] = "out gl_PerVertex {\n"
							  "  vec4 gl_Position;\n"
							  "};\n";
		}
		srcStrings[i++] = "in vec4 a_position;\n";
		srcStrings[i++] = "void main ()\n";
		srcStrings[i++] = "{\n";
		srcStrings[i++] = "    gl_Position = a_position;\n";
		srcStrings[i++] = "}\n";

		program = gl.createShaderProgramv(GL_VERTEX_SHADER, i, srcStrings);
		if (!checkCSProg(gl, program))
		{
			TCU_FAIL("CreateShaderProgramv failed for vertex shader");
		}

		gl.deleteProgram(program);

		// Half as many strings
		i				= 0;
		srcStrings[i++] = glu::getGLSLVersionDeclaration(m_glslVersion);
		srcStrings[i++] = "\n";
		if (m_glslVersion >= glu::GLSL_VERSION_410)
		{
			srcStrings[i++] = "out gl_PerVertex {\n"
							  "  vec4 gl_Position;\n"
							  "};\n";
		}
		srcStrings[i++] = "in vec4 a_position;\n"
						  "void main ()\n";
		srcStrings[i++] = "{\n"
						  "    gl_Position = a_position;\n";
		srcStrings[i++] = "}\n";

		program = gl.createShaderProgramv(GL_VERTEX_SHADER, i, srcStrings);
		if (!checkCSProg(gl, program))
		{
			TCU_FAIL("CreateShaderProgramv failed for vertex shader");
		}

		gl.deleteProgram(program);

		// Fragment shader
		i				= 0;
		srcStrings[i++] = glu::getGLSLVersionDeclaration(m_glslVersion);
		srcStrings[i++] = "\nin highp vec4 u_color;\n";
		srcStrings[i++] = "layout(location = 0) out mediump vec4 o_color;\n";
		srcStrings[i++] = "void main ()\n";
		srcStrings[i++] = "{\n";
		srcStrings[i++] = "    o_color = u_color;\n";
		srcStrings[i++] = "}\n";

		program = gl.createShaderProgramv(GL_FRAGMENT_SHADER, i, srcStrings);
		if (!checkCSProg(gl, program))
		{
			TCU_FAIL("CreateShaderProgramv failed for fragment shader");
		}

		gl.deleteProgram(program);

		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShaderProgramv failed");

		// Negative Cases

		// invalid type
		program = gl.createShaderProgramv(GL_MAX_FRAGMENT_UNIFORM_VECTORS, i, srcStrings);
		err		= gl.getError();
		if ((program != 0) || (err != GL_INVALID_ENUM))
		{
			TCU_FAIL("CreateShaderProgramv failed");
		}

		// Negative count
		program = gl.createShaderProgramv(GL_FRAGMENT_SHADER, -1, srcStrings);
		err		= gl.getError();
		if ((program != 0) || (err != GL_INVALID_VALUE))
		{
			TCU_FAIL("CreateShaderProgramv failed");
		}

		// source compile error
		i				= 0;
		srcStrings[i++] = glu::getGLSLVersionDeclaration(m_glslVersion);
		srcStrings[i++] = "\nin highp vec4 u_color;\n";
		srcStrings[i++] = "layout(location = 0) out mediump vec4 o_color;\n";
		srcStrings[i++] = "void main ()\n";
		srcStrings[i++] = "{\n";
		srcStrings[i++] = "    o_color = u_color;\n";

		program = gl.createShaderProgramv(GL_FRAGMENT_SHADER, i, srcStrings);
		// expect valid program and false for link status
		if (!checkCSProg(gl, program, GL_FALSE, GL_FALSE))
		{
			TCU_FAIL("CreateShaderProgramv failed for fragment shader");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShaderProgramv failed");
		gl.deleteProgram(program);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}